

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearLabelCase::iterate(ClearLabelCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 *puVar7;
  long *plVar8;
  size_t sVar9;
  NotSupportedError *this_00;
  size_type *psVar10;
  size_type *psVar11;
  long lVar12;
  ulong uVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int outlen;
  ScopedLogSection section;
  ResultCollector result;
  char buffer [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d8;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  string local_298;
  int local_274;
  code *local_270;
  int local_268;
  undefined4 local_25c;
  ScopedLogSection local_258;
  undefined8 local_250;
  undefined1 local_248 [112];
  ios_base local_1d8 [8];
  ios_base local_1d0 [264];
  ResultCollector local_c8;
  char local_78 [72];
  long lVar6;
  
  bVar4 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar4) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x79e);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  psVar11 = (size_type *)(local_248 + 0x10);
  local_248._0_8_ = psVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_c8,pTVar2,(string *)local_248);
  if ((size_type *)local_248._0_8_ != psVar11) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  local_274 = -1;
  local_250 = (**(code **)(lVar6 + 0x640))(0x9117,0);
  iVar5 = (**(code **)(lVar6 + 0x800))();
  if (iVar5 != 0) {
    local_2b8 = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
    local_270 = glu::getErrorName;
    local_268 = iVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
    uVar13 = 0xf;
    if (local_2b8 != local_2a8) {
      uVar13 = local_2a8[0];
    }
    if (uVar13 < local_298._M_string_length + local_2b0) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar14 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_00375f39;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
    }
    else {
LAB_00375f39:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar15) {
      local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2e8._8_8_ = puVar7[3];
    }
    else {
      local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
    }
    local_2f0 = puVar7[1];
    *puVar7 = paVar15;
    puVar7[1] = 0;
    paVar15->_M_local_buf[0] = '\0';
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2d8.field_2._M_allocated_capacity = *psVar10;
      local_2d8.field_2._8_8_ = plVar8[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar10;
      local_2d8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_2d8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar10) {
      local_248._16_8_ = *psVar10;
      local_248._24_8_ = plVar8[3];
      local_248._0_8_ = psVar11;
    }
    else {
      local_248._16_8_ = *psVar10;
      local_248._0_8_ = (size_type *)*plVar8;
    }
    local_248._8_8_ = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if ((size_type *)local_248._0_8_ != psVar11) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
  }
  local_25c = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  iVar5 = (**(code **)(lVar6 + 0x800))();
  if (iVar5 == 0) goto LAB_00376338;
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
  local_270 = glu::getErrorName;
  local_268 = iVar5;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
  uVar13 = 0xf;
  if (local_2b8 != local_2a8) {
    uVar13 = local_2a8[0];
  }
  if (uVar13 < local_298._M_string_length + local_2b0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      uVar14 = local_298.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_0037618b;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_0037618b:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
  }
  local_2f8 = &local_2e8;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar15) {
    local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2e8._8_8_ = puVar7[3];
  }
  else {
    local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7;
  }
  local_2f0 = puVar7[1];
  *puVar7 = paVar15;
  puVar7[1] = 0;
  paVar15->_M_local_buf[0] = '\0';
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8.field_2._8_8_ = plVar8[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2d8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_248._16_8_ = *psVar10;
    local_248._24_8_ = plVar8[3];
    local_248._0_8_ = psVar11;
  }
  else {
    local_248._16_8_ = *psVar10;
    local_248._0_8_ = (size_type *)*plVar8;
  }
  local_248._8_8_ = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ResultCollector::fail(&local_c8,(string *)local_248);
  if ((size_type *)local_248._0_8_ != psVar11) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
LAB_00376338:
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248._0_8_ = psVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Shader","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Shader object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar2,(string *)local_248,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  poVar1 = (ostringstream *)(local_248 + 8);
  lVar12 = 8;
  do {
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Setting label to string: \"",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"This is a debug label",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar6 + 0xfc0))(0x82e1,local_25c,0xfffffffe,"This is a debug label");
    iVar5 = (**(code **)(lVar6 + 0x800))();
    if (iVar5 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar14 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_00376537;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_00376537:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      paVar15->_M_local_buf[0] = '\0';
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248._0_8_ = local_248 + 0x10;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        local_248._16_8_ = *psVar11;
        local_248._24_8_ = plVar8[3];
      }
      else {
        local_248._16_8_ = *psVar11;
        local_248._0_8_ = (size_type *)*plVar8;
      }
      local_248._8_8_ = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Clearing label ",0xf);
    pcVar3 = *(char **)(&UNK_00b44ca8 + lVar12);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_248._8_8_ - 0x18));
    }
    else {
      sVar9 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar3,sVar9);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar6 + 0xfc0))
              (0x82e1,local_25c,
               *(undefined4 *)((long)&iterate::s_clearMethods[0].description + lVar12),0);
    iVar5 = (**(code **)(lVar6 + 0x800))();
    if (iVar5 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar14 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_0037685d;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_0037685d:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      paVar15->_M_local_buf[0] = '\0';
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248._0_8_ = local_248 + 0x10;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        local_248._16_8_ = *psVar11;
        local_248._24_8_ = plVar8[3];
      }
      else {
        local_248._16_8_ = *psVar11;
        local_248._0_8_ = (size_type *)*plVar8;
      }
      local_248._8_8_ = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_248 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248 + 8),"Querying label",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_248 + 8));
    std::ios_base::~ios_base(local_1d0);
    local_78[0] = 'X';
    local_274 = -1;
    (**(code **)(lVar6 + 0x958))(0x82e1,local_25c,0x40,&local_274,local_78);
    iVar5 = (**(code **)(lVar6 + 0x800))();
    if (iVar5 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar14 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_00376b64;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_00376b64:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      paVar15->_M_local_buf[0] = '\0';
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_248._0_8_ = local_248 + 0x10;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_248._16_8_ = paVar15->_M_allocated_capacity;
        local_248._24_8_ = puVar7[3];
      }
      else {
        local_248._16_8_ = paVar15->_M_allocated_capacity;
        local_248._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar7;
      }
      local_248._8_8_ = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    if (local_274 == 0) {
      if (local_78[0] == '\0') {
        local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_248 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_248 + 8),"Got 0-sized null-terminated string.",0x23);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_248 + 8));
        std::ios_base::~ios_base(local_1d0);
      }
      else {
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"label was not null terminated","");
        tcu::ResultCollector::fail(&local_c8,(string *)local_248);
        uVar14 = local_248._16_8_;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_248 + 0x10)) goto LAB_00376e83;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
      std::ostream::operator<<((MessageBuilder *)local_248,local_274);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
      std::ios_base::~ios_base(local_1d8);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x95f0fe);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_2e8._M_allocated_capacity;
      paVar15 = local_2f8;
      if (local_2f8 != &local_2e8) {
LAB_00376e83:
        operator_delete(paVar15,uVar14 + 1);
      }
    }
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x38);
  tcu::TestLog::endSection(local_258.m_log);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Sync","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Sync object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar2,(string *)local_248,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  poVar1 = (ostringstream *)(local_248 + 8);
  lVar12 = 8;
  do {
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Setting label to string: \"",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"This is a debug label",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar6 + 0xfc8))(local_250,0xfffffffe,"This is a debug label");
    iVar5 = (**(code **)(lVar6 + 0x800))();
    if (iVar5 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar14 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_0037710b;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_0037710b:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      paVar15->_M_local_buf[0] = '\0';
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248._0_8_ = local_248 + 0x10;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        local_248._16_8_ = *psVar11;
        local_248._24_8_ = plVar8[3];
      }
      else {
        local_248._16_8_ = *psVar11;
        local_248._0_8_ = (size_type *)*plVar8;
      }
      local_248._8_8_ = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Clearing label ",0xf);
    pcVar3 = *(char **)(&UNK_00b44ca8 + lVar12);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_248._8_8_ - 0x18));
    }
    else {
      sVar9 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar3,sVar9);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar6 + 0xfc8))
              (local_250,*(undefined4 *)((long)&iterate::s_clearMethods[0].description + lVar12),0);
    iVar5 = (**(code **)(lVar6 + 0x800))();
    if (iVar5 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar14 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_0037742d;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_0037742d:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      paVar15->_M_local_buf[0] = '\0';
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248._0_8_ = local_248 + 0x10;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        local_248._16_8_ = *psVar11;
        local_248._24_8_ = plVar8[3];
      }
      else {
        local_248._16_8_ = *psVar11;
        local_248._0_8_ = (size_type *)*plVar8;
      }
      local_248._8_8_ = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_248 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248 + 8),"Querying label",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_248 + 8));
    std::ios_base::~ios_base(local_1d0);
    local_78[0] = 'X';
    local_274 = -1;
    (**(code **)(lVar6 + 0x960))(local_250,0x40,&local_274,local_78);
    iVar5 = (**(code **)(lVar6 + 0x800))();
    if (iVar5 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar14 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_298._M_string_length + local_2b0) goto LAB_00377730;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_00377730:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      paVar15->_M_local_buf[0] = '\0';
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_248._0_8_ = local_248 + 0x10;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar15) {
        local_248._16_8_ = paVar15->_M_allocated_capacity;
        local_248._24_8_ = puVar7[3];
      }
      else {
        local_248._16_8_ = paVar15->_M_allocated_capacity;
        local_248._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar7;
      }
      local_248._8_8_ = puVar7[1];
      *puVar7 = paVar15;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_248 + 0x10)) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    if (local_274 == 0) {
      if (local_78[0] == '\0') {
        local_248._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_248 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_248 + 8),"Got 0-sized null-terminated string.",0x23);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_248 + 8));
        std::ios_base::~ios_base(local_1d0);
      }
      else {
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"label was not null terminated","");
        tcu::ResultCollector::fail(&local_c8,(string *)local_248);
        uVar14 = local_248._16_8_;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_248 + 0x10)) goto LAB_00377a4f;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
      std::ostream::operator<<((MessageBuilder *)local_248,local_274);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
      std::ios_base::~ios_base(local_1d8);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x95f0fe);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_2d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_2e8._M_allocated_capacity;
      paVar15 = local_2f8;
      if (local_2f8 != &local_2e8) {
LAB_00377a4f:
        operator_delete(paVar15,uVar14 + 1);
      }
    }
    lVar12 = lVar12 + 0x10;
    if (lVar12 == 0x38) {
      tcu::TestLog::endSection(local_258.m_log);
      (**(code **)(lVar6 + 0x470))(local_25c);
      (**(code **)(lVar6 + 0x478))(local_250);
      tcu::ResultCollector::setTestContextResult
                (&local_c8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
        operator_delete(local_c8.m_message._M_dataplus._M_p,
                        local_c8.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_prefix._M_dataplus._M_p != &local_c8.m_prefix.field_2) {
        operator_delete(local_c8.m_prefix._M_dataplus._M_p,
                        local_c8.m_prefix.field_2._M_allocated_capacity + 1);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

ClearLabelCase::IterateResult ClearLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	static const struct
	{
		const char*	description;
		int			length;
	} s_clearMethods[] =
	{
		{ " with NULL label and 0 length",			0	},
		{ " with NULL label and 1 length",			1	},
		{ " with NULL label and negative length",	-1	},
	};

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, -2,  msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectPtrLabel(sync, -2, msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectPtrLabel(sync, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}